

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O3

void __thiscall
poplar::compact_bonsai_nlm<int,32ul>::
expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
          (compact_bonsai_nlm<int,32ul> *this,node_map *pos_map)

{
  void *pvVar1;
  long lVar2;
  uint64_t uVar3;
  uint uVar4;
  uint32_t capa_bits;
  ulong chunk_id;
  ulong i;
  char_range new_slice;
  compact_bonsai_nlm<int,_32UL> local_70;
  
  lVar2 = (*(long *)(this + 8) - *(long *)this) * 8;
  capa_bits = 0;
  if (lVar2 != 0) {
    capa_bits = 0x40 - (int)LZCOUNT(lVar2 + -1);
  }
  compact_bonsai_nlm<int,_32UL>::compact_bonsai_nlm(&local_70,capa_bits);
  if ((pos_map->map_).size_ != 0) {
    i = 0;
    do {
      uVar3 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i);
      chunk_id = i >> 5;
      uVar4 = (uint)i & 0x1f;
      if (uVar3 != 0xffffffffffffffff) {
        new_slice = compact_bonsai_nlm<int,_32UL>::get_slice_
                              ((compact_bonsai_nlm<int,_32UL> *)this,chunk_id,(ulong)uVar4);
        if (new_slice.begin != new_slice.end) {
          compact_bonsai_nlm<int,_32UL>::set_slice_
                    (&local_70,uVar3 >> 5,(ulong)((uint)uVar3 & 0x1f),new_slice);
        }
      }
      if (uVar4 == 0x1f) {
        pvVar1 = *(void **)(*(long *)this + chunk_id * 8);
        *(undefined8 *)(*(long *)this + chunk_id * 8) = 0;
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
        }
      }
      i = i + 1;
    } while (i < (pos_map->map_).size_);
  }
  local_70.size_ = *(uint64_t *)(this + 0x30);
  local_70.label_bytes_ = *(uint64_t *)(this + 0x38);
  compact_bonsai_nlm<int,_32UL>::operator=((compact_bonsai_nlm<int,_32UL> *)this,&local_70);
  compact_bonsai_nlm<int,_32UL>::~compact_bonsai_nlm(&local_70);
  return;
}

Assistant:

void expand(const T& pos_map) {
        this_type new_ls(bit_tools::ceil_log2(ptrs_.size() * ChunkSize * 2));

        for (uint64_t pos = 0; pos < pos_map.size(); ++pos) {
            auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);
            uint64_t new_pos = pos_map[pos];
            if (new_pos != UINT64_MAX) {
                auto orig_slice = get_slice_(chunk_id, pos_in_chunk);
                if (!orig_slice.empty()) {
                    auto [new_chunk_id, new_pos_in_chunk] = decompose_value<ChunkSize>(new_pos);
                    new_ls.set_slice_(new_chunk_id, new_pos_in_chunk, orig_slice);
                }
            }
            if (pos_in_chunk == ChunkSize - 1) {
                ptrs_[chunk_id].reset();
            }
        }

        new_ls.size_ = size_;
#ifdef POPLAR_EXTRA_STATS
        new_ls.max_length_ = max_length_;
        new_ls.sum_length_ = sum_length_;
#endif
        new_ls.label_bytes_ = label_bytes_;
        *this = std::move(new_ls);
    }